

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helper.h
# Opt level: O0

uchar Test_Helper::randomValue<unsigned_char>(uchar minimum,uint32_t maximum)

{
  uint uVar1;
  uint in_ESI;
  byte in_DIL;
  uchar value;
  undefined1 local_9;
  undefined1 local_1;
  
  if (in_ESI == 0) {
    local_1 = 0;
  }
  else {
    uVar1 = rand();
    local_9 = (byte)(uVar1 % in_ESI);
    if ((uVar1 % in_ESI & 0xff) < (uint)in_DIL) {
      local_9 = in_DIL;
    }
    local_1 = local_9;
  }
  return local_1;
}

Assistant:

data randomValue( data minimum, uint32_t maximum )
    {
        if( maximum == 0 ) {
            return 0;
        }
        else {
            data value = static_cast<data>(static_cast<uint32_t>(rand()) % maximum);

            if( value < minimum )
                value = minimum;

            return value;
        }
    }